

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_set_status(nng_http *conn,nng_http_status status,char *reason)

{
  char *reason_local;
  nng_http_status status_local;
  nng_http *conn_local;
  
  nni_http_set_status(conn,status,reason);
  return;
}

Assistant:

void
nng_http_set_status(nng_http *conn, nng_http_status status, const char *reason)
{
#ifdef NNG_SUPP_HTTP
	nni_http_set_status(conn, status, reason);
#else
	NNI_ARG_UNUSED(res);
	NNI_ARG_UNUSED(status);
	NNI_ARG_UNUSED(reason);
#endif
}